

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O0

fdb_status fdb_get_kvs_ops_info(fdb_kvs_handle *handle,fdb_kvs_ops_info *info)

{
  uint64_t uVar1;
  uint64_t *in_RSI;
  fdb_kvs_handle *in_RDI;
  fdb_kvs_handle *root_handle;
  kvs_ops_stat root_stat;
  kvs_ops_stat stat;
  filemgr *file;
  fdb_kvs_id_t kv_id;
  memory_order in_stack_ffffffffffffff5c;
  fdb_kvs_handle *stat_00;
  fdb_kvs_id_t in_stack_ffffffffffffff68;
  filemgr *in_stack_ffffffffffffff70;
  kvs_ops_stat *in_stack_ffffffffffffff88;
  kvs_ops_stat *in_stack_ffffffffffffff90;
  fdb_status local_4;
  
  if (in_RDI == (fdb_kvs_handle *)0x0) {
    local_4 = FDB_RESULT_INVALID_HANDLE;
  }
  else if (in_RSI == (uint64_t *)0x0) {
    local_4 = FDB_RESULT_INVALID_ARGS;
  }
  else {
    stat_00 = in_RDI->fhandle->root;
    if (in_RDI->shandle == (snap_handle *)0x0) {
      fdb_check_file_reopen(in_RDI,(file_status_t *)0x0);
      fdb_sync_db_header(root_handle);
    }
    _kvs_ops_stat_get(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,(kvs_ops_stat *)stat_00);
    if (stat_00 == in_RDI) {
      kvs_ops_stat::operator=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    }
    else {
      _kvs_ops_stat_get(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,(kvs_ops_stat *)stat_00)
      ;
    }
    uVar1 = atomic_get_uint64_t((atomic<unsigned_long> *)stat_00,in_stack_ffffffffffffff5c);
    *in_RSI = uVar1;
    uVar1 = atomic_get_uint64_t((atomic<unsigned_long> *)stat_00,in_stack_ffffffffffffff5c);
    in_RSI[1] = uVar1;
    uVar1 = atomic_get_uint64_t((atomic<unsigned_long> *)stat_00,in_stack_ffffffffffffff5c);
    in_RSI[4] = uVar1;
    uVar1 = atomic_get_uint64_t((atomic<unsigned_long> *)stat_00,in_stack_ffffffffffffff5c);
    in_RSI[5] = uVar1;
    uVar1 = atomic_get_uint64_t((atomic<unsigned_long> *)stat_00,in_stack_ffffffffffffff5c);
    in_RSI[5] = uVar1;
    uVar1 = atomic_get_uint64_t((atomic<unsigned_long> *)stat_00,in_stack_ffffffffffffff5c);
    in_RSI[6] = uVar1;
    uVar1 = atomic_get_uint64_t((atomic<unsigned_long> *)stat_00,in_stack_ffffffffffffff5c);
    in_RSI[2] = uVar1;
    uVar1 = atomic_get_uint64_t((atomic<unsigned_long> *)stat_00,in_stack_ffffffffffffff5c);
    in_RSI[3] = uVar1;
    local_4 = FDB_RESULT_SUCCESS;
  }
  return local_4;
}

Assistant:

LIBFDB_API
fdb_status fdb_get_kvs_ops_info(fdb_kvs_handle *handle, fdb_kvs_ops_info *info)
{
    fdb_kvs_id_t kv_id;
    struct filemgr *file;
    struct kvs_ops_stat stat;
    struct kvs_ops_stat root_stat;

    if (!handle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    if (!info) {
        return FDB_RESULT_INVALID_ARGS;
    }

    fdb_kvs_handle *root_handle = handle->fhandle->root;

    // for snapshot handle do not reopen new file as user is interested in
    // reader stats from the old file
    if (!handle->shandle) {
        // always get stats from the latest file
        fdb_check_file_reopen(handle, NULL);
        fdb_sync_db_header(handle);
    }

    file = handle->file;

    if (handle->kvs == NULL) {
        kv_id = 0;
    } else {
        kv_id = handle->kvs->id;
    }

    _kvs_ops_stat_get(file, kv_id, &stat);

    if (root_handle != handle) {
        _kvs_ops_stat_get(file, 0, &root_stat);
    } else {
        root_stat = stat;
    }

    info->num_sets = atomic_get_uint64_t(&stat.num_sets, std::memory_order_relaxed);
    info->num_dels = atomic_get_uint64_t(&stat.num_dels, std::memory_order_relaxed);
    info->num_gets = atomic_get_uint64_t(&stat.num_gets, std::memory_order_relaxed);
    info->num_iterator_gets = atomic_get_uint64_t(&stat.num_iterator_gets,
                                                  std::memory_order_relaxed);
    info->num_iterator_gets = atomic_get_uint64_t(&stat.num_iterator_gets,
                                                  std::memory_order_relaxed);
    info->num_iterator_moves = atomic_get_uint64_t(&stat.num_iterator_moves,
                                                   std::memory_order_relaxed);

    info->num_commits = atomic_get_uint64_t(&root_stat.num_commits,
                                            std::memory_order_relaxed);
    info->num_compacts = atomic_get_uint64_t(&root_stat.num_compacts,
                                             std::memory_order_relaxed);
    return FDB_RESULT_SUCCESS;
}